

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpScanner.cpp
# Opt level: O0

void __thiscall glslang::TPpContext::missingEndifCheck(TPpContext *this)

{
  TParseContextBase *pTVar1;
  TSourceLoc *pTVar2;
  TPpContext *this_local;
  
  if (0 < this->ifdepth) {
    pTVar1 = this->parseContext;
    pTVar2 = TParseVersions::getCurrentLoc(&this->parseContext->super_TParseVersions);
    (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[0x2f])(pTVar1,pTVar2,"missing #endif","");
  }
  return;
}

Assistant:

void TPpContext::missingEndifCheck()
{
    if (ifdepth > 0)
        parseContext.ppError(parseContext.getCurrentLoc(), "missing #endif", "", "");
}